

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiplePursuit.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_6fc9f::MpPursuer::update(MpPursuer *this,float currentTime,float elapsedTime)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Vec3 VVar9;
  Vec3 local_20;
  
  fVar6 = elapsedTime;
  uVar3 = (**(code **)((long)(this->super_MpBase).super_SimpleVehicle.super_SimpleVehicle_3.
                             super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                             .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                             super_AbstractVehicle.super_AbstractLocalSpace + 0x40))();
  fVar5 = fVar6;
  uVar4 = (**(code **)((long)(this->wanderer->super_MpBase).super_SimpleVehicle.
                             super_SimpleVehicle_3.
                             super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                             .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                             super_AbstractVehicle.super_AbstractLocalSpace + 0x40))();
  fVar7 = (float)uVar3 - (float)uVar4;
  fVar8 = (float)((ulong)uVar3 >> 0x20) - (float)((ulong)uVar4 >> 0x20);
  fVar1 = (float)(**(code **)((long)(this->super_MpBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                    .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                    super_AbstractVehicle.super_AbstractLocalSpace + 0xc0))(this);
  fVar2 = (float)(**(code **)((long)(this->wanderer->super_MpBase).super_SimpleVehicle.
                                    super_SimpleVehicle_3.
                                    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                    .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                    super_AbstractVehicle.super_AbstractLocalSpace + 0xc0))();
  if (SQRT((fVar6 - fVar5) * (fVar6 - fVar5) + fVar7 * fVar7 + fVar8 * fVar8) < fVar2 + fVar1) {
    reset(this);
  }
  VVar9 = OpenSteer::
          SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
          ::steerForPursuit((SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
                             *)this,(AbstractVehicle *)this->wanderer,20.0);
  fVar6 = VVar9.z;
  local_20._0_8_ = VVar9._0_8_;
  local_20.z = fVar6;
  OpenSteer::SimpleVehicle::applySteeringForce((SimpleVehicle *)this,&local_20,elapsedTime);
  local_20._0_8_ =
       (**(code **)((long)(this->super_MpBase).super_SimpleVehicle.super_SimpleVehicle_3.
                          super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                          .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
                          super_AbstractLocalSpace + 0x40))(this);
  local_20.z = fVar6;
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  recordTrailVertex((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this
                    ,currentTime,&local_20);
  return;
}

Assistant:

void update (const float currentTime, const float elapsedTime)
        {
            // when pursuer touches quarry ("wanderer"), reset its position
            const float d = Vec3::distance (position(), wanderer->position());
            const float r = radius() + wanderer->radius();
            if (d < r) reset ();

            const float maxTime = 20; // xxx hard-to-justify value
            applySteeringForce (steerForPursuit (*wanderer, maxTime), elapsedTime);

            // for annotation
            recordTrailVertex (currentTime, position());
        }